

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::AddLinkLibrary(cmTarget *this,cmMakefile *mf,string *lib,cmTargetLinkLibraryType llt)

{
  char *pcVar1;
  pointer pcVar2;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var3;
  size_t __n;
  int iVar4;
  PolicyStatus PVar5;
  cmTarget *pcVar6;
  long *plVar7;
  size_type sVar8;
  cmValue cVar9;
  size_type *psVar10;
  byte bVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string dependencies;
  string libName;
  cmTargetLinkLibraryType local_bc;
  undefined1 local_b8 [32];
  string local_98;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  _Storage<cmListFileBacktrace,_false> local_68;
  char local_58;
  string local_50;
  
  bVar11 = 0;
  local_bc = llt;
  pcVar6 = cmMakefile::FindTargetToUse(mf,lib,false);
  if (pcVar6 != (cmTarget *)0x0) {
    bVar11 = ((pcVar6->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ^ 1;
  }
  if ((bVar11 == 0) || (local_bc == GENERAL_LibraryType)) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    pcVar2 = (lib->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + lib->_M_string_length);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   "$<TARGET_NAME:",lib);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_b8);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_98.field_2._M_allocated_capacity = *psVar10;
      local_98.field_2._8_8_ = plVar7[3];
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar10;
      local_98._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_98._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
  }
  pcVar1 = local_b8 + 0x10;
  local_b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"LINK_LIBRARIES","");
  GetDebugGeneratorExpressions(&local_50,this,&local_98,local_bc);
  cmMakefile::GetBacktrace(mf);
  local_68._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_78;
  local_68._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)_Stack_70._M_pi;
  local_78 = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = '\x01';
  AppendProperty(this,(string *)local_b8,&local_50,
                 (optional<cmListFileBacktrace> *)&local_68._M_value,false);
  if ((local_58 == '\x01') &&
     (local_58 = '\0',
     local_68._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_b8._0_8_ != pcVar1) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  sVar8 = cmGeneratorExpression::Find(lib);
  if (sVar8 != 0xffffffffffffffff) {
    return;
  }
  if (pcVar6 != (cmTarget *)0x0) {
    iVar4 = ((pcVar6->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
    if (iVar4 == 4) {
      return;
    }
    if (iVar4 == 7) {
      return;
    }
  }
  _Var3._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  __n = *(size_type *)((long)&(_Var3._M_head_impl)->Name + 8);
  if (__n == lib->_M_string_length) {
    if (__n == 0) {
      return;
    }
    iVar4 = bcmp(((_Var3._M_head_impl)->Name)._M_dataplus._M_p,(lib->_M_dataplus)._M_p,__n);
    if (iVar4 == 0) {
      return;
    }
  }
  std::
  vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
  ::emplace_back<std::__cxx11::string_const&,cmTargetLinkLibraryType&>
            ((vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
              *)&(_Var3._M_head_impl)->OriginalLinkLibraries,lib,&local_bc);
  _Var3._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var3._M_head_impl)->TargetType - 1 < 3) {
    PVar5 = cmPolicies::PolicyMap::Get(&(_Var3._M_head_impl)->PolicyMap,CMP0073);
    if ((PVar5 != OLD) &&
       (PVar5 = cmPolicies::PolicyMap::Get
                          (&((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            PolicyMap,CMP0073), PVar5 != WARN)) {
      return;
    }
    _Var3._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    local_b8._8_8_ = ((_Var3._M_head_impl)->Name)._M_dataplus;
    local_b8._0_8_ = *(size_type *)((long)&(_Var3._M_head_impl)->Name + 8);
    local_b8._16_8_ = 0xc;
    local_b8._24_8_ = "_LIB_DEPENDS";
    views._M_len = 2;
    views._M_array = (iterator)local_b8;
    cmCatViews_abi_cxx11_(&local_98,views);
    local_b8._8_8_ = (char *)0x0;
    local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
    local_b8._0_8_ = pcVar1;
    cVar9 = cmMakefile::GetDefinition(mf,&local_98);
    if (cVar9.Value != (string *)0x0) {
      std::__cxx11::string::_M_append(local_b8,(ulong)((cVar9.Value)->_M_dataplus)._M_p);
    }
    if (local_bc < (OPTIMIZED_LibraryType|DEBUG_LibraryType)) {
      std::__cxx11::string::append(local_b8);
    }
    std::__cxx11::string::append(local_b8);
    std::__cxx11::string::_M_append(local_b8,(ulong)(lib->_M_dataplus)._M_p);
    std::__cxx11::string::append(local_b8);
    cmMakefile::AddCacheDefinition
              (mf,&local_98,(char *)local_b8._0_8_,"Dependencies for the target",STATIC,false);
    if ((char *)local_b8._0_8_ != pcVar1) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf, std::string const& lib,
                              cmTargetLinkLibraryType llt)
{
  cmTarget* tgt = mf.FindTargetToUse(lib);
  {
    const bool isNonImportedTarget = tgt && !tgt->IsImported();

    const std::string libName =
      (isNonImportedTarget && llt != GENERAL_LibraryType)
      ? targetNameGenex(lib)
      : lib;
    this->AppendProperty("LINK_LIBRARIES",
                         this->GetDebugGeneratorExpressions(libName, llt),
                         mf.GetBacktrace());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos ||
      (tgt &&
       (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        tgt->GetType() == cmStateEnums::OBJECT_LIBRARY)) ||
      (this->impl->Name == lib)) {
    return;
  }

  this->impl->OriginalLinkLibraries.emplace_back(lib, llt);

  // Add the explicit dependency information for libraries. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if (this->impl->TargetType >= cmStateEnums::STATIC_LIBRARY &&
      this->impl->TargetType <= cmStateEnums::MODULE_LIBRARY &&
      (this->GetPolicyStatusCMP0073() == cmPolicies::OLD ||
       this->GetPolicyStatusCMP0073() == cmPolicies::WARN)) {
    std::string targetEntry = cmStrCat(this->impl->Name, "_LIB_DEPENDS");
    std::string dependencies;
    cmValue old_val = mf.GetDefinition(targetEntry);
    if (old_val) {
      dependencies += *old_val;
    }
    switch (llt) {
      case GENERAL_LibraryType:
        dependencies += "general";
        break;
      case DEBUG_LibraryType:
        dependencies += "debug";
        break;
      case OPTIMIZED_LibraryType:
        dependencies += "optimized";
        break;
    }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition(targetEntry, dependencies,
                          "Dependencies for the target", cmStateEnums::STATIC);
  }
}